

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O1

void __thiscall Result::showyourself(Result *this)

{
  pointer pCVar1;
  ostream *poVar2;
  pointer pCVar3;
  Core core;
  Core local_48;
  
  pCVar3 = (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar1) {
    do {
      local_48.CurrentProcessingTime = pCVar3->CurrentProcessingTime;
      std::vector<Task,_std::allocator<Task>_>::vector(&local_48.MyTasks,&pCVar3->MyTasks);
      Core::showyourself(&local_48);
      if (local_48.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->longestProcessingTime);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void Result::showyourself(){
	for (auto core : Cores)
		core.showyourself();
	std::cout<<"Total time: "<<longestProcessingTime<<"\n";
}